

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O2

vector_type * __thiscall
Disa::Vector_Dense<double,3ul>::operator-=
          (Vector_Dense<double,3ul> *this,Vector_Dense<double,_2UL> *vector)

{
  ostream *poVar1;
  source_location *in_RCX;
  string sStack_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined **local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
  local_38 = &PTR_s__workspace_llm4binary_github_lic_001547a8;
  console_format_abi_cxx11_(&local_30,(Disa *)0x0,(Log_Level)&local_38,in_RCX);
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  std::__cxx11::to_string(&local_d8,3);
  std::operator+(&local_b8,"Incompatible vector sizes, ",&local_d8);
  std::operator+(&local_98,&local_b8," vs. ");
  std::__cxx11::to_string(&sStack_f8,2);
  std::operator+(&local_78,&local_98,&sStack_f8);
  std::operator+(&local_58,&local_78,".");
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&sStack_f8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_30);
  exit(1);
}

Assistant:

constexpr vector_type& operator-=(const Vector_Dense<_type, _size_other>& vector) {
    ASSERT_DEBUG(_size == vector.size(),
                 "Incompatible vector sizes, " + std::to_string(_size) + " vs. " + std::to_string(vector.size()) + ".");
    FOR(index, _size)(*this)[index] -= vector[index];
    return *this;
  }